

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::PointRenderCase::
genTessellationEvaluationSource_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  ostream *poVar1;
  byte bVar2;
  char *pcVar3;
  bool *pbVar4;
  char *pcVar5;
  ostringstream buf;
  ostringstream local_1a0 [376];
  
  bVar2 = (*(byte *)((long)this + 0x81) ^ 1) & *(byte *)((long)this + 0xd8);
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar1 = std::operator<<((ostream *)local_1a0,
                           "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n");
  pcVar3 = "${TESSELLATION_POINT_SIZE_REQUIRE}\n";
  pcVar5 = SSBOArrayLengthTests::init::arraysSized + 1;
  if (bVar2 == 0) {
    pcVar3 = SSBOArrayLengthTests::init::arraysSized + 1;
  }
  poVar1 = std::operator<<(poVar1,pcVar3);
  poVar1 = std::operator<<(poVar1,
                           "layout(quads, point_mode) in;\nin highp vec4 tess_ctrl_color[];\nout highp vec4 tess_color;\nuniform highp vec4 u_posScale;\n\npatch in highp vec3 vp_bbox_clipMin;\npatch in highp vec3 vp_bbox_clipMax;\n"
                          );
  pbVar4 = (bool *)0x857499;
  if (*(char *)((long)this + 0x81) != '\0') {
    pbVar4 = SSBOArrayLengthTests::init::arraysSized + 1;
  }
  poVar1 = std::operator<<(poVar1,pbVar4);
  poVar1 = std::operator<<(poVar1,"flat out highp vec3 v_");
  pcVar3 = SSBOArrayLengthTests::init::arraysSized + 1;
  if (*(char *)((long)this + 0x81) != '\0') {
    pcVar3 = "geo_";
  }
  poVar1 = std::operator<<(poVar1,pcVar3);
  poVar1 = std::operator<<(poVar1,"bbox_clipMin;\nflat out highp vec3 v_");
  pcVar3 = SSBOArrayLengthTests::init::arraysSized + 1;
  if (*(char *)((long)this + 0x81) != '\0') {
    pcVar3 = "geo_";
  }
  poVar1 = std::operator<<(poVar1,pcVar3);
  poVar1 = std::operator<<(poVar1,"bbox_clipMax;\n\n");
  poVar1 = std::operator<<(poVar1,
                           "vec4 mirrorY(in highp vec4 p)\n{\n\thighp vec2 patternOffset = u_posScale.xy;\n\thighp vec2 patternScale = u_posScale.zw;\n\thighp vec2 patternCenter = patternOffset + patternScale * 0.5;\n\treturn vec4(p.x, 2.0 * patternCenter.y - p.y, p.z, p.w);\n}\n"
                          );
  poVar1 = std::operator<<(poVar1,
                           "void main()\n{\n\t// non-trivial tessellation evaluation shader, convert from nonsensical coords, flip vertically\n\thighp vec2 patternScale = u_posScale.zw;\n\thighp vec4 offset = vec4((gl_TessCoord.xy * 2.0 - vec2(1.0)) * 0.07 * patternScale, 0.0, 0.0);\n\thighp float pointSize = "
                          );
  pcVar3 = "1.0";
  if (bVar2 != 0) {
    pcVar3 = "(tess_ctrl_color[0].g > 0.0) ? (5.0) : (3.0)";
  }
  poVar1 = std::operator<<(poVar1,pcVar3);
  std::operator<<(poVar1,";\n\tgl_Position = mirrorY(gl_in[0].gl_Position.zwyx + offset);\n");
  if (bVar2 != 0) {
    std::operator<<((ostream *)local_1a0,"\tgl_PointSize = pointSize;\n");
  }
  poVar1 = std::operator<<((ostream *)local_1a0,"\ttess_color = tess_ctrl_color[0];\n");
  pcVar3 = "v_bbox_expansionSize = pointSize;\n";
  if (*(char *)((long)this + 0x81) != '\0') {
    pcVar3 = SSBOArrayLengthTests::init::arraysSized + 1;
  }
  poVar1 = std::operator<<(poVar1,pcVar3);
  poVar1 = std::operator<<(poVar1,"\tv_");
  pcVar3 = SSBOArrayLengthTests::init::arraysSized + 1;
  if (*(char *)((long)this + 0x81) != '\0') {
    pcVar3 = "geo_";
  }
  poVar1 = std::operator<<(poVar1,pcVar3);
  poVar1 = std::operator<<(poVar1,"bbox_clipMin = vp_bbox_clipMin;\n\tv_");
  if (*(char *)((long)this + 0x81) != '\0') {
    pcVar5 = "geo_";
  }
  poVar1 = std::operator<<(poVar1,pcVar5);
  std::operator<<(poVar1,"bbox_clipMax = vp_bbox_clipMax;\n}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string PointRenderCase::genTessellationEvaluationSource (void) const
{
	const bool			tessellationWidePoints = (m_isWidePointCase) && (!m_hasGeometryStage);
	std::ostringstream	buf;

	buf <<	"${GLSL_VERSION_DECL}\n"
			"${TESSELLATION_SHADER_REQUIRE}\n"
		<<	((tessellationWidePoints) ? ("${TESSELLATION_POINT_SIZE_REQUIRE}\n") : (""))
		<<	"layout(quads, point_mode) in;"
			"\n"
			"in highp vec4 tess_ctrl_color[];\n"
			"out highp vec4 tess_color;\n"
			"uniform highp vec4 u_posScale;\n"
			"\n"
			"patch in highp vec3 vp_bbox_clipMin;\n"
			"patch in highp vec3 vp_bbox_clipMax;\n"
		<<	((!m_hasGeometryStage) ? ("flat out highp float v_bbox_expansionSize;\n") : (""))
		<<	"flat out highp vec3 v_" << (m_hasGeometryStage ? "geo_" : "") << "bbox_clipMin;\n"
			"flat out highp vec3 v_" << (m_hasGeometryStage ? "geo_" : "") << "bbox_clipMax;\n"
			"\n"
		<<	genShaderFunction(SHADER_FUNC_MIRROR_Y)
		<<	"void main()\n"
			"{\n"
			"	// non-trivial tessellation evaluation shader, convert from nonsensical coords, flip vertically\n"
			"	highp vec2 patternScale = u_posScale.zw;\n"
			"	highp vec4 offset = vec4((gl_TessCoord.xy * 2.0 - vec2(1.0)) * 0.07 * patternScale, 0.0, 0.0);\n"
			"	highp float pointSize = " << ((tessellationWidePoints) ? ("(tess_ctrl_color[0].g > 0.0) ? (5.0) : (3.0)") : ("1.0")) << ";\n"
			"	gl_Position = mirrorY(gl_in[0].gl_Position.zwyx + offset);\n";

	if (tessellationWidePoints)
		buf << "	gl_PointSize = pointSize;\n";

	buf <<	"	tess_color = tess_ctrl_color[0];\n"
		<<	((!m_hasGeometryStage) ? ("v_bbox_expansionSize = pointSize;\n") : (""))
		<<	"	v_" << (m_hasGeometryStage ? "geo_" : "") << "bbox_clipMin = vp_bbox_clipMin;\n"
			"	v_" << (m_hasGeometryStage ? "geo_" : "") << "bbox_clipMax = vp_bbox_clipMax;\n"
			"}\n";

	return buf.str();
}